

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect_bounder.cc
# Opt level: O0

S2LatLngRect * __thiscall
S2LatLngRectBounder::GetBound(S2LatLngRect *__return_storage_ptr__,S2LatLngRectBounder *this)

{
  S2LatLngRect local_50;
  undefined1 local_28 [8];
  S2LatLng kExpansion;
  S2LatLngRectBounder *this_local;
  
  kExpansion.coords_.c_[1] = (VType)this;
  _local_28 = (VType  [2])S2LatLng::FromRadians(4.440892098500626e-16,0.0);
  S2LatLngRect::Expanded(&local_50,&this->bound_,(S2LatLng *)local_28);
  S2LatLngRect::PolarClosure(__return_storage_ptr__,&local_50);
  S2LatLngRect::~S2LatLngRect(&local_50);
  return __return_storage_ptr__;
}

Assistant:

S2LatLngRect S2LatLngRectBounder::GetBound() const {
  // To save time, we ignore numerical errors in the computed S2LatLngs while
  // accumulating the bounds and then account for them here.
  //
  // S2LatLng(S2Point) has a maximum error of 0.955 * DBL_EPSILON in latitude.
  // In the worst case, we might have rounded "inwards" when computing the
  // bound and "outwards" when computing the latitude of a contained point P,
  // therefore we expand the latitude bounds by 2 * DBL_EPSILON in each
  // direction.  (A more complex analysis shows that 1.5 * DBL_EPSILON is
  // enough, but the expansion amount should be a multiple of DBL_EPSILON in
  // order to avoid rounding errors during the expansion itself.)
  //
  // S2LatLng(S2Point) has a maximum error of DBL_EPSILON in longitude, which
  // is simply the maximum rounding error for results in the range [-Pi, Pi].
  // This is true because the Gnu implementation of atan2() comes from the IBM
  // Accurate Mathematical Library, which implements correct rounding for this
  // instrinsic (i.e., it returns the infinite precision result rounded to the
  // nearest representable value, with ties rounded to even values).  This
  // implies that we don't need to expand the longitude bounds at all, since
  // we only guarantee that the bound contains the *rounded* latitudes of
  // contained points.  The *true* latitudes of contained points may lie up to
  // DBL_EPSILON outside of the returned bound.

  const S2LatLng kExpansion = S2LatLng::FromRadians(2 * DBL_EPSILON, 0);
  return bound_.Expanded(kExpansion).PolarClosure();
}